

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

xmlXPathObjectPtr xmlXPathCacheObjectCopy(xmlXPathParserContextPtr pctxt,xmlXPathObjectPtr val)

{
  xmlNodeSetPtr val_00;
  xmlXPathObjectPtr pxVar1;
  
  if (val == (xmlXPathObjectPtr)0x0) {
LAB_001c4d22:
    pxVar1 = (xmlXPathObjectPtr)0x0;
  }
  else {
    if ((pctxt->context != (xmlXPathContextPtr)0x0) && (pctxt->context->cache != (void *)0x0)) {
      switch(val->type) {
      case XPATH_NODESET:
        val_00 = xmlXPathNodeSetMerge((xmlNodeSetPtr)0x0,val->nodesetval);
        if (val_00 != (xmlNodeSetPtr)0x0) {
          pxVar1 = xmlXPathCacheWrapNodeSet(pctxt,val_00);
          return pxVar1;
        }
        xmlXPathPErrMemory(pctxt);
        goto LAB_001c4d22;
      case XPATH_BOOLEAN:
        pxVar1 = xmlXPathCacheNewBoolean(pctxt,val->boolval);
        return pxVar1;
      case XPATH_NUMBER:
        pxVar1 = xmlXPathCacheNewFloat(pctxt,val->floatval);
        return pxVar1;
      case XPATH_STRING:
        pxVar1 = xmlXPathCacheNewString(pctxt,val->stringval);
        return pxVar1;
      }
    }
    pxVar1 = xmlXPathObjectCopy(val);
    if (pxVar1 == (xmlXPathObjectPtr)0x0) {
      xmlXPathPErrMemory(pctxt);
    }
  }
  return pxVar1;
}

Assistant:

static xmlXPathObjectPtr
xmlXPathCacheObjectCopy(xmlXPathParserContextPtr pctxt, xmlXPathObjectPtr val)
{
    xmlXPathObjectPtr ret;
    xmlXPathContextPtr ctxt = pctxt->context;

    if (val == NULL)
	return(NULL);

    if ((ctxt != NULL) && (ctxt->cache != NULL)) {
	switch (val->type) {
            case XPATH_NODESET: {
                xmlNodeSetPtr set;

                set = xmlXPathNodeSetMerge(NULL, val->nodesetval);
                if (set == NULL) {
                    xmlXPathPErrMemory(pctxt);
                    return(NULL);
                }
                return(xmlXPathCacheWrapNodeSet(pctxt, set));
            }
	    case XPATH_STRING:
		return(xmlXPathCacheNewString(pctxt, val->stringval));
	    case XPATH_BOOLEAN:
		return(xmlXPathCacheNewBoolean(pctxt, val->boolval));
	    case XPATH_NUMBER:
		return(xmlXPathCacheNewFloat(pctxt, val->floatval));
	    default:
		break;
	}
    }
    ret = xmlXPathObjectCopy(val);
    if (ret == NULL)
        xmlXPathPErrMemory(pctxt);
    return(ret);
}